

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void MirrorSplitUVRow_C(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  long lVar1;
  long lVar2;
  uint8_t *puVar3;
  
  lVar1 = (long)width + -1;
  puVar3 = src_uv + (int)lVar1 * 2;
  for (lVar2 = 0; lVar2 < lVar1; lVar2 = lVar2 + 2) {
    dst_u[lVar2] = *puVar3;
    dst_u[lVar2 + 1] = puVar3[-2];
    dst_v[lVar2] = puVar3[1];
    dst_v[lVar2 + 1] = puVar3[-1];
    puVar3 = puVar3 + -4;
  }
  if ((width & 1U) != 0) {
    dst_u[lVar1] = *puVar3;
    dst_v[lVar1] = puVar3[1];
  }
  return;
}

Assistant:

void MirrorSplitUVRow_C(const uint8_t* src_uv,
                        uint8_t* dst_u,
                        uint8_t* dst_v,
                        int width) {
  int x;
  src_uv += (width - 1) << 1;
  for (x = 0; x < width - 1; x += 2) {
    dst_u[x] = src_uv[0];
    dst_u[x + 1] = src_uv[-2];
    dst_v[x] = src_uv[1];
    dst_v[x + 1] = src_uv[-2 + 1];
    src_uv -= 4;
  }
  if (width & 1) {
    dst_u[width - 1] = src_uv[0];
    dst_v[width - 1] = src_uv[1];
  }
}